

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

void assertVersion(char *prog,char *base)

{
  wchar_t wVar1;
  size_t l;
  char *_v1;
  ushort **ppuVar2;
  ulong uVar3;
  void *in_R8;
  char *pcVar4;
  byte *_v1_00;
  byte *pbVar5;
  size_t sVar6;
  void *in_stack_ffffffffffffffa8;
  size_t s;
  byte *local_38;
  
  l = strlen(base);
  wVar1 = systemf("%s --version >version.stdout 2>version.stderr",prog);
  if (wVar1 == L'\0') {
    wVar1 = L'\x01';
  }
  else {
    wVar1 = systemf("%s -W version >version.stdout 2>version.stderr",prog);
    wVar1 = (wchar_t)(wVar1 == L'\0');
  }
  failure("Unable to run either %s --version or %s -W version",prog,prog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ॱ',wVar1,"r == 0",in_R8);
  if (wVar1 != L'\0') {
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
               ,L'ॵ',"version.stderr");
    _v1 = slurpfile(&s,"version.stdout");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                     ,L'ॻ',(uint)(l + 1 < s),"s > prog_len + 1",in_R8);
    failure("Version must start with \'%s\': ``%s\'\'",base,_v1);
    wVar1 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                                ,L'ॾ',_v1,"q",base,"base",l,"prog_len",in_stack_ffffffffffffffa8);
    if (wVar1 != L'\0') {
      s = s - l;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                       ,L'অ',(uint)(_v1[l] == ' '),"*q == \' \'",base);
      local_38 = (byte *)(_v1 + l + 1);
      s = s - 1;
      assert_version_id((char **)&local_38,&s);
      failure("No `-\' between program name and versions: ``%s\'\'",_v1);
      pbVar5 = local_38;
      pcVar4 = "- ";
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                          ,L'ঌ',local_38,"q","- ","\"- \"",2,"2",in_stack_ffffffffffffffa8);
      s = s - 2;
      failure("Not long enough for libarchive version: ``%s\'\'",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                       ,L'ঐ',(uint)(0xb < s),"s > 11",pcVar4);
      failure("Libarchive version must start with `libarchive\': ``%s\'\'",_v1);
      pcVar4 = "libarchive ";
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                          ,L'ও',pbVar5 + 2,"q","libarchive ","\"libarchive \"",0xb,"11",
                          in_stack_ffffffffffffffa8);
      local_38 = pbVar5 + 0xd;
      s = s - 0xb;
      assert_version_id((char **)&local_38,&s);
      pbVar5 = local_38;
      if (s != 0) {
        pbVar5 = local_38 + s;
        _v1_00 = local_38;
        do {
          sVar6 = s - 1;
          uVar3 = (ulong)*_v1_00;
          if (((0x2f < uVar3) || ((0xe00100000000U >> (uVar3 & 0x3f) & 1) == 0)) &&
             (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[uVar3] & 8) == 0)) {
            wVar1 = L'\x01';
            goto LAB_00105fa3;
          }
          _v1_00 = _v1_00 + 1;
          s = sVar6;
        } while (sVar6 != 0);
      }
      wVar1 = L'\0';
      _v1_00 = pbVar5;
LAB_00105fa3:
      local_38 = _v1_00;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                       ,L'ড',wVar1,"s >= 1",pcVar4);
      failure("Version output must end with \\n or \\r\\n");
      if (*_v1_00 == 0xd) {
        _v1_00 = _v1_00 + 1;
        s = s - 1;
        local_38 = _v1_00;
      }
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                          ,L'ধ',_v1_00,"q","\n","\"\\n\"",1,"1",in_stack_ffffffffffffffa8);
    }
    free(_v1);
  }
  return;
}

Assistant:

void assertVersion(const char *prog, const char *base)
{
	int r;
	char *p, *q;
	size_t s;
	size_t prog_len = strlen(base);

	r = systemf("%s --version >version.stdout 2>version.stderr", prog);
	if (r != 0)
		r = systemf("%s -W version >version.stdout 2>version.stderr",
		    prog);

	failure("Unable to run either %s --version or %s -W version",
		prog, prog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stdout. */
	assertEmptyFile("version.stderr");

	/* Verify format of version message. */
	q = p = slurpfile(&s, "version.stdout");

	/* Version message should start with name of program, then space. */
	assert(s > prog_len + 1);

	failure("Version must start with '%s': ``%s''", base, p);
	if (!assertEqualMem(q, base, prog_len)) {
		free(p);
		return;
	}

	q += prog_len; s -= prog_len;

	assert(*q == ' ');
	q++; s--;

	assert_version_id(&q, &s);

	/* Separator. */
	failure("No `-' between program name and versions: ``%s''", p);
	assertEqualMem(q, "- ", 2);
	q += 2; s -= 2;

	failure("Not long enough for libarchive version: ``%s''", p);
	assert(s > 11);

	failure("Libarchive version must start with `libarchive': ``%s''", p);
	assertEqualMem(q, "libarchive ", 11);

	q += 11; s -= 11;

	assert_version_id(&q, &s);

	/* Skip arbitrary third-party version numbers. */
	while (s > 0 && (*q == ' ' || *q == '-' || *q == '/' || *q == '.' ||
	    isalnum((unsigned char)*q))) {
		++q;
		--s;
	}

	/* All terminated by end-of-line. */
	assert(s >= 1);

	/* Skip an optional CR character (e.g., Windows) */
	failure("Version output must end with \\n or \\r\\n");

	if (*q == '\r') { ++q; --s; }
	assertEqualMem(q, "\n", 1);

	free(p);
}